

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-vfp.inc.c
# Opt level: O0

_Bool trans_VMOV_imm_sp(DisasContext_conflict1 *s,arg_VMOV_imm_sp *a)

{
  TCGContext_conflict1 *tcg_ctx_00;
  _Bool _Var1;
  uint64_t uVar2;
  TCGv_i32 var;
  int local_3c;
  uint32_t vd;
  TCGv_i32 fd;
  int veclen;
  uint32_t delta_d;
  TCGContext_conflict1 *tcg_ctx;
  arg_VMOV_imm_sp *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  fd._4_4_ = 0;
  fd._0_4_ = s->vec_len;
  local_3c = a->vd;
  _Var1 = isar_feature_aa32_fpsp_v3(s->isar);
  if (_Var1) {
    _Var1 = isar_feature_aa32_fpshvec(s->isar);
    if ((_Var1) || (((int)fd == 0 && (s->vec_stride == 0)))) {
      _Var1 = vfp_access_check(s);
      if (_Var1) {
        if (0 < (int)fd) {
          _Var1 = vfp_sreg_is_scalar(local_3c);
          if (_Var1) {
            fd._0_4_ = 0;
          }
          else {
            fd._4_4_ = s->vec_stride + 1;
          }
        }
        uVar2 = vfp_expand_imm_aarch64(2,(uint8_t)a->imm);
        var = tcg_const_i32_aarch64(tcg_ctx_00,(int32_t)uVar2);
        while (neon_store_reg32(tcg_ctx_00,var,local_3c), (int)fd != 0) {
          fd._0_4_ = (int)fd + -1;
          local_3c = vfp_advance_sreg(local_3c,fd._4_4_);
        }
        tcg_temp_free_i32(tcg_ctx_00,var);
        s_local._7_1_ = true;
      }
      else {
        s_local._7_1_ = true;
      }
    }
    else {
      s_local._7_1_ = false;
    }
  }
  else {
    s_local._7_1_ = false;
  }
  return s_local._7_1_;
}

Assistant:

static bool trans_VMOV_imm_sp(DisasContext *s, arg_VMOV_imm_sp *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    uint32_t delta_d = 0;
    int veclen = s->vec_len;
    TCGv_i32 fd;
    uint32_t vd;

    vd = a->vd;

    if (!dc_isar_feature(aa32_fpsp_v3, s)) {
        return false;
    }

    if (!dc_isar_feature(aa32_fpshvec, s) &&
        (veclen != 0 || s->vec_stride != 0)) {
        return false;
    }

    if (!vfp_access_check(s)) {
        return true;
    }

    if (veclen > 0) {
        /* Figure out what type of vector operation this is.  */
        if (vfp_sreg_is_scalar(vd)) {
            /* scalar */
            veclen = 0;
        } else {
            delta_d = s->vec_stride + 1;
        }
    }

    fd = tcg_const_i32(tcg_ctx, vfp_expand_imm(MO_32, a->imm));

    for (;;) {
        neon_store_reg32(tcg_ctx, fd, vd);

        if (veclen == 0) {
            break;
        }

        /* Set up the operands for the next iteration */
        veclen--;
        vd = vfp_advance_sreg(vd, delta_d);
    }

    tcg_temp_free_i32(tcg_ctx, fd);
    return true;
}